

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAAckpntGet(IDAMem IDA_mem,IDAckpntMem ck_mem)

{
  int iVar1;
  N_Vector in_RSI;
  N_Vector *in_RDI;
  int is;
  int j;
  int flag;
  int local_24;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI[0x18].sunctx == (SUNContext_conflict)0x0) {
    IDASetInitStep(in_RSI,(sunrealtype)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                  );
    iVar1 = IDAReInit((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (sunrealtype)in_RDI,in_RSI,
                      (N_Vector)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((*(int *)&in_RSI[2].sunctx != 0) &&
       (iVar1 = IDAQuadReInit(in_RSI,(N_Vector)(ulong)in_stack_ffffffffffffffe0), iVar1 != 0)) {
      return iVar1;
    }
    if ((*(int *)&in_RSI[5].content != 0) &&
       (iVar1 = IDASensReInit(_j,is,(N_Vector *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI), iVar1 != 0)) {
      return iVar1;
    }
    if ((*(int *)&in_RSI[7].ops != 0) &&
       (iVar1 = IDAQuadSensReInit(in_RSI,(N_Vector *)(ulong)in_stack_ffffffffffffffe0), iVar1 != 0))
    {
      return iVar1;
    }
  }
  else {
    in_RDI[0xb7] = (N_Vector)in_RSI[9].sunctx;
    in_RDI[0xa0] = (N_Vector)in_RSI[10].content;
    *(undefined4 *)(in_RDI + 0x97) = *(undefined4 *)((long)&in_RSI[10].ops + 4);
    *(undefined4 *)((long)in_RDI + 0x4bc) = *(undefined4 *)&in_RSI[10].sunctx;
    *(undefined4 *)(in_RDI + 0x98) = *(undefined4 *)((long)&in_RSI[10].sunctx + 4);
    *(undefined4 *)((long)in_RDI + 0x4c4) = *(undefined4 *)&in_RSI[0xb].content;
    *(undefined4 *)(in_RDI + 0x99) = *(undefined4 *)&in_RSI[10].ops;
    in_RDI[0x9c] = (N_Vector)in_RSI[0xb].ops;
    in_RDI[0x9d] = (N_Vector)in_RSI[0xb].sunctx;
    in_RDI[0x9e] = (N_Vector)in_RSI[0xc].content;
    in_RDI[0xa1] = (N_Vector)in_RSI[0xc].ops;
    in_RDI[0xa2] = (N_Vector)in_RSI[0xc].sunctx;
    in_RDI[0xa3] = (N_Vector)in_RSI[0xd].content;
    in_RDI[0xa4] = (N_Vector)in_RSI[0xd].ops;
    in_RDI[0x9f] = (N_Vector)in_RSI->content;
    in_RDI[0xa5] = (N_Vector)in_RSI[0xd].sunctx;
    in_RDI[0xaa] = (N_Vector)in_RSI[0xe].content;
    for (iVar1 = 0; iVar1 < *(int *)&in_RSI[0x18].ops; iVar1 = iVar1 + 1) {
      N_VScale(0x3ff0000000000000,(&in_RSI->sunctx)[iVar1],in_RDI[(long)iVar1 + 0x2b]);
    }
    if (*(int *)&in_RSI[2].sunctx != 0) {
      for (iVar1 = 0; iVar1 < *(int *)&in_RSI[0x18].ops; iVar1 = iVar1 + 1) {
        N_VScale(0x3ff0000000000000,(&in_RSI[3].content)[iVar1],in_RDI[(long)iVar1 + 0x60]);
      }
    }
    if (*(int *)&in_RSI[5].content != 0) {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x14); local_24 = local_24 + 1) {
        for (iVar1 = 0; iVar1 < *(int *)&in_RSI[0x18].ops; iVar1 = iVar1 + 1) {
          N_VScale(0x3ff0000000000000,(&(&in_RSI[5].ops)[iVar1]->nvgetvectorid)[local_24],
                   (&in_RDI[(long)iVar1 + 0x6a]->content)[local_24]);
        }
      }
    }
    if (*(int *)&in_RSI[7].ops != 0) {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x14); local_24 = local_24 + 1) {
        for (iVar1 = 0; iVar1 < *(int *)&in_RSI[0x18].ops; iVar1 = iVar1 + 1) {
          N_VScale(0x3ff0000000000000,(&(&in_RSI[7].sunctx)[iVar1]->profiler)[local_24],
                   (&in_RDI[(long)iVar1 + 0x80]->content)[local_24]);
        }
      }
    }
    for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
      in_RDI[(long)iVar1 + 0x31] = (N_Vector)(&in_RSI[0xe].ops)[iVar1];
      in_RDI[(long)iVar1 + 0x37] = (N_Vector)(&in_RSI[0x10].ops)[iVar1];
      in_RDI[(long)iVar1 + 0x3d] = (N_Vector)(&in_RSI[0x12].ops)[iVar1];
      in_RDI[(long)iVar1 + 0x43] = (N_Vector)(&in_RSI[0x14].ops)[iVar1];
      in_RDI[(long)iVar1 + 0x49] = (N_Vector)(&in_RSI[0x16].ops)[iVar1];
    }
    *(undefined4 *)(in_RDI + 0xee) = 1;
  }
  return 0;
}

Assistant:

static int IDAAckpntGet(IDAMem IDA_mem, IDAckpntMem ck_mem)
{
  int flag, j, is;

  if (ck_mem->ck_next == NULL)
  {
    /* In this case, we just call the reinitialization routine,
     * but make sure we use the same initial stepsize as on
     * the first run. */

    IDASetInitStep(IDA_mem, IDA_mem->ida_h0u);

    flag = IDAReInit(IDA_mem, ck_mem->ck_t0, ck_mem->ck_phi[0],
                     ck_mem->ck_phi[1]);
    if (flag != IDA_SUCCESS) { return (flag); }

    if (ck_mem->ck_quadr)
    {
      flag = IDAQuadReInit(IDA_mem, ck_mem->ck_phiQ[0]);
      if (flag != IDA_SUCCESS) { return (flag); }
    }

    if (ck_mem->ck_sensi)
    {
      flag = IDASensReInit(IDA_mem, IDA_mem->ida_ism, ck_mem->ck_phiS[0],
                           ck_mem->ck_phiS[1]);
      if (flag != IDA_SUCCESS) { return (flag); }
    }

    if (ck_mem->ck_quadr_sensi)
    {
      flag = IDAQuadSensReInit(IDA_mem, ck_mem->ck_phiQS[0]);
      if (flag != IDA_SUCCESS) { return (flag); }
    }
  }
  else
  {
    /* Copy parameters from check point data structure */
    IDA_mem->ida_nst      = ck_mem->ck_nst;
    IDA_mem->ida_tretlast = ck_mem->ck_tretlast;
    IDA_mem->ida_kk       = ck_mem->ck_kk;
    IDA_mem->ida_kused    = ck_mem->ck_kused;
    IDA_mem->ida_knew     = ck_mem->ck_knew;
    IDA_mem->ida_phase    = ck_mem->ck_phase;
    IDA_mem->ida_ns       = ck_mem->ck_ns;
    IDA_mem->ida_hh       = ck_mem->ck_hh;
    IDA_mem->ida_hused    = ck_mem->ck_hused;
    IDA_mem->ida_eta      = ck_mem->ck_eta;
    IDA_mem->ida_cj       = ck_mem->ck_cj;
    IDA_mem->ida_cjlast   = ck_mem->ck_cjlast;
    IDA_mem->ida_cjold    = ck_mem->ck_cjold;
    IDA_mem->ida_cjratio  = ck_mem->ck_cjratio;
    IDA_mem->ida_tn       = ck_mem->ck_t0;
    IDA_mem->ida_ss       = ck_mem->ck_ss;
    IDA_mem->ida_ssS      = ck_mem->ck_ssS;

    /* Copy the arrays from check point data structure */
    for (j = 0; j < ck_mem->ck_phi_alloc; j++)
    {
      N_VScale(ONE, ck_mem->ck_phi[j], IDA_mem->ida_phi[j]);
    }

    if (ck_mem->ck_quadr)
    {
      for (j = 0; j < ck_mem->ck_phi_alloc; j++)
      {
        N_VScale(ONE, ck_mem->ck_phiQ[j], IDA_mem->ida_phiQ[j]);
      }
    }

    if (ck_mem->ck_sensi)
    {
      for (is = 0; is < IDA_mem->ida_Ns; is++)
      {
        for (j = 0; j < ck_mem->ck_phi_alloc; j++)
        {
          N_VScale(ONE, ck_mem->ck_phiS[j][is], IDA_mem->ida_phiS[j][is]);
        }
      }
    }

    if (ck_mem->ck_quadr_sensi)
    {
      for (is = 0; is < IDA_mem->ida_Ns; is++)
      {
        for (j = 0; j < ck_mem->ck_phi_alloc; j++)
        {
          N_VScale(ONE, ck_mem->ck_phiQS[j][is], IDA_mem->ida_phiQS[j][is]);
        }
      }
    }

    for (j = 0; j < MXORDP1; j++)
    {
      IDA_mem->ida_psi[j]   = ck_mem->ck_psi[j];
      IDA_mem->ida_alpha[j] = ck_mem->ck_alpha[j];
      IDA_mem->ida_beta[j]  = ck_mem->ck_beta[j];
      IDA_mem->ida_sigma[j] = ck_mem->ck_sigma[j];
      IDA_mem->ida_gamma[j] = ck_mem->ck_gamma[j];
    }

    /* Force a call to setup */
    IDA_mem->ida_forceSetup = SUNTRUE;
  }

  return (IDA_SUCCESS);
}